

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractspinbox.cpp
# Opt level: O1

void QAbstractSpinBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QFlagsStorage<Qt::AlignmentFlag> *pQVar2;
  int *piVar3;
  long lVar4;
  QArrayData *pQVar5;
  char16_t *pcVar6;
  byte bVar7;
  bool bVar8;
  ushort uVar9;
  QFlagsStorage<Qt::AlignmentFlag> QVar10;
  long lVar11;
  ushort uVar12;
  int iVar13;
  undefined8 uVar14;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    iVar13 = 0;
    goto LAB_00484bd4;
  case 1:
    iVar13 = 1;
LAB_00484bd4:
    QMetaObject::activate(_o,&staticMetaObject,iVar13,(void **)0x0);
    break;
  case 2:
    lVar11 = *(long *)_o;
    uVar14 = 1;
    goto LAB_00484bbd;
  case 3:
    lVar11 = *(long *)_o;
    uVar14 = 0xffffffff;
LAB_00484bbd:
    (**(code **)(lVar11 + 0x1b0))(_o,uVar14);
    break;
  case 4:
    selectAll((QAbstractSpinBox *)_o);
    break;
  case 5:
    (**(code **)(*(long *)_o + 0x1b8))(_o);
  }
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_00484b72_caseD_3;
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == editingFinished) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_00484b72_caseD_3;
      }
      if (((code *)*plVar1 == returnPressed) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_00484b72_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_00484b72_caseD_3;
        goto switchD_00484b72_caseD_1;
      }
    }
    goto switchD_00484b72_caseD_2;
  }
switchD_00484b72_caseD_1:
  if (0xb < (uint)_id) goto LAB_00484de8;
  pQVar2 = (QFlagsStorage<Qt::AlignmentFlag> *)*_a;
  switch(_id) {
  case 0:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 2;
    break;
  case 1:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 4;
    break;
  case 2:
    QVar10.i = (Int)QLineEdit::alignment(*(QLineEdit **)(*(long *)(_o + 8) + 0x378));
    goto LAB_00484de4;
  case 3:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 1;
    break;
  case 4:
    QVar10.i = *(Int *)(*(long *)(_o + 8) + 0x3c0);
    goto LAB_00484de4;
  case 5:
    lVar11 = *(long *)(_o + 8);
    piVar3 = *(int **)(lVar11 + 0x288);
    lVar4 = *(long *)(lVar11 + 0x290);
    lVar11 = *(long *)(lVar11 + 0x298);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    pQVar5 = *(QArrayData **)pQVar2;
    *(int **)pQVar2 = piVar3;
    *(long *)(pQVar2 + 2) = lVar4;
    *(long *)(pQVar2 + 4) = lVar11;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar13 = (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
joined_r0x00484dad:
      if (iVar13 == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
    goto LAB_00484de8;
  case 6:
    QLineEdit::displayText(&local_50,*(QLineEdit **)(*(long *)(_o + 8) + 0x378));
    pQVar5 = *(QArrayData **)pQVar2;
    *(Data **)pQVar2 = local_50.d.d;
    pcVar6 = *(char16_t **)(pQVar2 + 2);
    *(char16_t **)(pQVar2 + 2) = local_50.d.ptr;
    lVar11 = *(long *)(pQVar2 + 4);
    *(qsizetype *)(pQVar2 + 4) = local_50.d.size;
    local_50.d.d = (Data *)pQVar5;
    local_50.d.ptr = pcVar6;
    local_50.d.size = lVar11;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar13 = (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      goto joined_r0x00484dad;
    }
    goto LAB_00484de8;
  case 7:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 5;
    break;
  case 8:
    QVar10.i = *(Int *)(*(long *)(_o + 8) + 0x3b8);
LAB_00484de4:
    pQVar2->i = QVar10.i;
    goto LAB_00484de8;
  case 9:
    bVar8 = QLineEdit::hasAcceptableInput(*(QLineEdit **)(*(long *)(_o + 8) + 0x378));
    goto LAB_00484dd4;
  case 10:
    bVar7 = *(byte *)(*(long *)(_o + 8) + 0x3d0) >> 6;
    break;
  case 0xb:
    *(byte *)&pQVar2->i = (byte)((ushort)*(undefined2 *)(*(long *)(_o + 8) + 0x3d0) >> 9) & 1;
    goto LAB_00484de8;
  }
  bVar8 = (bool)(bVar7 & 1);
LAB_00484dd4:
  *(bool *)&pQVar2->i = bVar8;
LAB_00484de8:
  if (_c != WriteProperty) goto switchD_00484b72_caseD_3;
switchD_00484b72_caseD_2:
  if (0xb < (uint)_id) goto switchD_00484b72_caseD_3;
  pQVar2 = (QFlagsStorage<Qt::AlignmentFlag> *)*_a;
  switch(_id) {
  case 0:
    *(ushort *)(*(long *)(_o + 8) + 0x3d0) =
         ((ushort)*(undefined4 *)(*(long *)(_o + 8) + 0x3d0) & 0xfffb) +
         (ushort)*(byte *)&pQVar2->i * 4;
    break;
  case 1:
    plVar1 = *(long **)(_o + 8);
    *(ushort *)(plVar1 + 0x7a) =
         (ushort)(int)plVar1[0x7a] & 0xffef | (ushort)*(byte *)&pQVar2->i << 4;
    QWidget::update((QWidget *)_o);
    (**(code **)(*plVar1 + 0x100))(plVar1);
    break;
  case 2:
    QLineEdit::setAlignment(*(QLineEdit **)(*(long *)(_o + 8) + 0x378),(Alignment)pQVar2->i);
    break;
  case 3:
    setReadOnly((QAbstractSpinBox *)_o,*(bool *)&pQVar2->i);
    break;
  case 4:
    setButtonSymbols((QAbstractSpinBox *)_o,pQVar2->i);
    break;
  case 5:
    plVar1 = *(long **)(_o + 8);
    QString::operator=((QString *)(plVar1 + 0x51),(QString *)pQVar2);
    plVar1[0x6d] = -1;
    (**(code **)(*plVar1 + 0xf8))(plVar1);
    (**(code **)(*plVar1 + 0xc0))(plVar1);
    break;
  case 7:
    lVar11 = *(long *)(_o + 8);
    uVar9 = (ushort)*(byte *)&pQVar2->i << 5;
    uVar12 = (ushort)*(undefined4 *)(lVar11 + 0x3d0) & 0xffdf;
    goto LAB_00484f0f;
  case 8:
    ((QFlagsStorage<Qt::AlignmentFlag> *)(*(long *)(_o + 8) + 0x3b8))->i = pQVar2->i;
    break;
  case 10:
    lVar11 = *(long *)(_o + 8);
    uVar9 = (ushort)*(byte *)&pQVar2->i << 6;
    uVar12 = (ushort)*(undefined4 *)(lVar11 + 0x3d0) & 0xffbf;
LAB_00484f0f:
    *(ushort *)(lVar11 + 0x3d0) = uVar12 | uVar9;
    break;
  case 0xb:
    setGroupSeparatorShown((QAbstractSpinBox *)_o,*(bool *)&pQVar2->i);
  }
switchD_00484b72_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractSpinBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->editingFinished(); break;
        case 1: _t->returnPressed(); break;
        case 2: _t->stepUp(); break;
        case 3: _t->stepDown(); break;
        case 4: _t->selectAll(); break;
        case 5: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractSpinBox::*)()>(_a, &QAbstractSpinBox::editingFinished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractSpinBox::*)()>(_a, &QAbstractSpinBox::returnPressed, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->wrapping(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->hasFrame(); break;
        case 2: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 4: *reinterpret_cast<ButtonSymbols*>(_v) = _t->buttonSymbols(); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->specialValueText(); break;
        case 6: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->isAccelerated(); break;
        case 8: *reinterpret_cast<CorrectionMode*>(_v) = _t->correctionMode(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->hasAcceptableInput(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->keyboardTracking(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->isGroupSeparatorShown(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWrapping(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setFrame(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 3: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setButtonSymbols(*reinterpret_cast<ButtonSymbols*>(_v)); break;
        case 5: _t->setSpecialValueText(*reinterpret_cast<QString*>(_v)); break;
        case 7: _t->setAccelerated(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setCorrectionMode(*reinterpret_cast<CorrectionMode*>(_v)); break;
        case 10: _t->setKeyboardTracking(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setGroupSeparatorShown(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}